

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O2

void __thiscall QHstsCache::updateFromHeaders(QHstsCache *this,QHttpHeaders *headers,QUrl *url)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QHstsHeaderParser parser;
  QDateTime aQStack_98 [8];
  QArrayDataPointer<char16_t> local_90;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHstsHeaderParser::QHstsHeaderParser((QHstsHeaderParser *)local_78);
    bVar2 = QHstsHeaderParser::parse((QHstsHeaderParser *)local_78,headers);
    if (bVar2) {
      QUrl::host(&local_90,url,0x7f00000);
      QDateTime::QDateTime(aQStack_98,(QDateTime *)(local_78 + 0x30));
      updateKnownHost(this,(QString *)&local_90,aQStack_98,puStack_30._0_1_);
      QDateTime::~QDateTime(aQStack_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      if (this->hstsStore != (QHstsStore *)0x0) {
        QHstsStore::synchronize(this->hstsStore);
      }
    }
    QHstsHeaderParser::~QHstsHeaderParser((QHstsHeaderParser *)local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateFromHeaders(const QHttpHeaders &headers,
                                   const QUrl &url)
{
    if (!url.isValid())
        return;

    QHstsHeaderParser parser;
    if (parser.parse(headers)) {
        updateKnownHost(url.host(), parser.expirationDate(), parser.includeSubDomains());
#if QT_CONFIG(settings)
        if (hstsStore)
            hstsStore->synchronize();
#endif // QT_CONFIG(settings)
    }
}